

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  seqDef *psVar9;
  bool bVar10;
  uint uVar11;
  BYTE *pStart;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong *ip_00;
  ulong *puVar15;
  BYTE *pBVar16;
  BYTE *ip;
  int iVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  BYTE *pBVar21;
  ulong *puVar22;
  U32 UVar23;
  ulong *puVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  BYTE *pInLoopLimit;
  uint uVar31;
  ulong local_b0;
  uint local_94;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar24 = (ulong *)((long)src + (srcSize - 8));
  pBVar21 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  ip_00 = (ulong *)((ulong)(pBVar21 == (BYTE *)src) + (long)src);
  uVar26 = (int)ip_00 - (int)pBVar21;
  uVar19 = (ulong)uVar5;
  if (uVar26 < uVar5) {
    uVar19 = 0;
  }
  uVar30 = (uint)uVar19;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar20 = (ulong)uVar6;
  if (uVar26 < uVar6) {
    uVar20 = 0;
  }
  uVar29 = (uint)uVar20;
  if (ip_00 < puVar24) {
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    do {
      local_94 = (uint)uVar19;
      uVar30 = (uint)uVar20;
      if ((uVar30 == 0) ||
         (*(int *)((long)ip_00 + 1) != *(int *)((long)((long)ip_00 + 1U) - uVar20))) {
        iVar17 = (int)ip_00;
        if (cParams->searchLength - 6 < 2) {
          pUVar8 = ms->chainTable;
          uVar14 = 1 << ((byte)cParams->chainLog & 0x1f);
          pBVar16 = (ms->window).base;
          uVar29 = (ms->window).lowLimit;
          uVar31 = iVar17 - (int)pBVar16;
          uVar12 = uVar31 - uVar14;
          if (uVar31 < uVar14) {
            uVar12 = 0;
          }
          uVar7 = cParams->searchLog;
          uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
          if (uVar11 <= uVar29) goto LAB_00199464;
          iVar17 = 1 << ((byte)uVar7 & 0x1f);
          local_b0 = 99999999;
          uVar13 = 3;
          do {
            puVar22 = (ulong *)(pBVar16 + uVar11);
            if (*(char *)(uVar13 + (long)puVar22) == *(char *)((long)ip_00 + uVar13)) {
              puVar15 = ip_00;
              if (ip_00 < puVar1) {
                uVar25 = *ip_00 ^ *puVar22;
                uVar27 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
                if (*puVar22 == *ip_00) {
                  do {
                    puVar15 = puVar15 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar15) goto LAB_00198fe2;
                    uVar25 = *puVar15 ^ *puVar22;
                    uVar27 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                      }
                    }
                    uVar27 = (long)puVar15 + ((uVar27 >> 3 & 0x1fffffff) - (long)ip_00);
                  } while (*puVar22 == *puVar15);
                }
              }
              else {
LAB_00198fe2:
                if ((puVar15 < puVar2) && ((int)*puVar22 == (int)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar15 < puVar3) && ((short)*puVar22 == (short)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar15 < puVar4) {
                  puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar22 == (char)*puVar15));
                }
                uVar27 = (long)puVar15 - (long)ip_00;
              }
            }
            else {
              uVar27 = 0;
            }
            if ((uVar13 < uVar27) &&
               (local_b0 = (ulong)((uVar31 + 2) - uVar11), uVar13 = uVar27,
               (ulong *)((long)ip_00 + uVar27) == puVar4)) {
              bVar10 = false;
            }
            else {
              uVar27 = uVar13;
              if (uVar12 < uVar11) {
                uVar11 = pUVar8[uVar11 & uVar14 - 1];
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
          } while (((bVar10) && (uVar29 < uVar11)) &&
                  (iVar17 = iVar17 + -1, uVar13 = uVar27, iVar17 != 0));
        }
        else if (cParams->searchLength == 5) {
          pUVar8 = ms->chainTable;
          uVar14 = 1 << ((byte)cParams->chainLog & 0x1f);
          pBVar16 = (ms->window).base;
          uVar29 = (ms->window).lowLimit;
          uVar31 = iVar17 - (int)pBVar16;
          uVar12 = uVar31 - uVar14;
          if (uVar31 < uVar14) {
            uVar12 = 0;
          }
          uVar7 = cParams->searchLog;
          uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
          if (uVar29 < uVar11) {
            iVar17 = 1 << ((byte)uVar7 & 0x1f);
            local_b0 = 99999999;
            uVar13 = 3;
            do {
              puVar22 = (ulong *)(pBVar16 + uVar11);
              if (*(char *)(uVar13 + (long)puVar22) == *(char *)((long)ip_00 + uVar13)) {
                puVar15 = ip_00;
                if (ip_00 < puVar1) {
                  uVar25 = *ip_00 ^ *puVar22;
                  uVar27 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar27 = uVar27 >> 3 & 0x1fffffff;
                  if (*puVar22 == *ip_00) {
                    do {
                      puVar15 = puVar15 + 1;
                      puVar22 = puVar22 + 1;
                      if (puVar1 <= puVar15) goto LAB_001991a6;
                      uVar25 = *puVar15 ^ *puVar22;
                      uVar27 = 0;
                      if (uVar25 != 0) {
                        for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = (long)puVar15 + ((uVar27 >> 3 & 0x1fffffff) - (long)ip_00);
                    } while (*puVar22 == *puVar15);
                  }
                }
                else {
LAB_001991a6:
                  if ((puVar15 < puVar2) && ((int)*puVar22 == (int)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 4);
                    puVar22 = (ulong *)((long)puVar22 + 4);
                  }
                  if ((puVar15 < puVar3) && ((short)*puVar22 == (short)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 2);
                    puVar22 = (ulong *)((long)puVar22 + 2);
                  }
                  if (puVar15 < puVar4) {
                    puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar22 == (char)*puVar15));
                  }
                  uVar27 = (long)puVar15 - (long)ip_00;
                }
              }
              else {
                uVar27 = 0;
              }
              if ((uVar13 < uVar27) &&
                 (local_b0 = (ulong)((uVar31 + 2) - uVar11), uVar13 = uVar27,
                 (ulong *)((long)ip_00 + uVar27) == puVar4)) {
                bVar10 = false;
              }
              else {
                uVar27 = uVar13;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar14 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar29 < uVar11)) &&
                    (iVar17 = iVar17 + -1, uVar13 = uVar27, iVar17 != 0));
          }
          else {
LAB_00199464:
            uVar27 = 3;
            local_b0 = 99999999;
          }
        }
        else {
          pUVar8 = ms->chainTable;
          uVar14 = 1 << ((byte)cParams->chainLog & 0x1f);
          pBVar16 = (ms->window).base;
          uVar29 = (ms->window).lowLimit;
          uVar31 = iVar17 - (int)pBVar16;
          uVar12 = uVar31 - uVar14;
          if (uVar31 < uVar14) {
            uVar12 = 0;
          }
          uVar7 = cParams->searchLog;
          uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
          if (uVar11 <= uVar29) goto LAB_00199464;
          iVar17 = 1 << ((byte)uVar7 & 0x1f);
          local_b0 = 99999999;
          uVar13 = 3;
          do {
            puVar22 = (ulong *)(pBVar16 + uVar11);
            if (*(char *)(uVar13 + (long)puVar22) == *(char *)((long)ip_00 + uVar13)) {
              puVar15 = ip_00;
              if (ip_00 < puVar1) {
                uVar25 = *ip_00 ^ *puVar22;
                uVar27 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
                if (*puVar22 == *ip_00) {
                  do {
                    puVar15 = puVar15 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar15) goto LAB_001993be;
                    uVar25 = *puVar15 ^ *puVar22;
                    uVar27 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                      }
                    }
                    uVar27 = (long)puVar15 + ((uVar27 >> 3 & 0x1fffffff) - (long)ip_00);
                  } while (*puVar22 == *puVar15);
                }
              }
              else {
LAB_001993be:
                if ((puVar15 < puVar2) && ((int)*puVar22 == (int)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar15 < puVar3) && ((short)*puVar22 == (short)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar15 < puVar4) {
                  puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar22 == (char)*puVar15));
                }
                uVar27 = (long)puVar15 - (long)ip_00;
              }
            }
            else {
              uVar27 = 0;
            }
            if ((uVar13 < uVar27) &&
               (local_b0 = (ulong)((uVar31 + 2) - uVar11), uVar13 = uVar27,
               (ulong *)((long)ip_00 + uVar27) == puVar4)) {
              bVar10 = false;
            }
            else {
              uVar27 = uVar13;
              if (uVar12 < uVar11) {
                uVar11 = pUVar8[uVar11 & uVar14 - 1];
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
          } while (((bVar10) && (uVar29 < uVar11)) &&
                  (iVar17 = iVar17 + -1, uVar13 = uVar27, iVar17 != 0));
        }
        if (3 < uVar27) {
          if (local_b0 == 0) {
            UVar23 = 1;
          }
          else {
            if ((src < ip_00) && (pBVar21 < (BYTE *)((long)ip_00 + (2 - local_b0)))) {
              puVar22 = ip_00;
              while (ip_00 = puVar22,
                    *(char *)((long)puVar22 - 1) == *(char *)((long)puVar22 + (1 - local_b0))) {
                ip_00 = (ulong *)((long)puVar22 - 1);
                uVar27 = uVar27 + 1;
                if ((ip_00 <= src) ||
                   (pBVar16 = (BYTE *)((long)puVar22 + (1 - local_b0)), puVar22 = ip_00,
                   pBVar16 <= pBVar21)) break;
              }
            }
            uVar20 = (ulong)((int)local_b0 - 2);
            UVar23 = (int)local_b0 + 1;
            local_94 = uVar30;
          }
          goto LAB_001994fc;
        }
        ip_00 = (ulong *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
      }
      else {
        puVar22 = (ulong *)((long)ip_00 + 5);
        puVar18 = (ulong *)((long)ip_00 + (5 - uVar20));
        puVar15 = puVar22;
        if (puVar22 < puVar1) {
          uVar13 = *puVar22 ^ *puVar18;
          uVar19 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          uVar27 = uVar19 >> 3 & 0x1fffffff;
          if (*puVar18 == *puVar22) {
            puVar15 = (ulong *)((long)ip_00 + 0xd);
            puVar18 = (ulong *)((long)ip_00 + (0xd - uVar20));
            do {
              if (puVar1 <= puVar15) goto LAB_00199258;
              uVar19 = *puVar18;
              uVar13 = *puVar15;
              uVar25 = uVar13 ^ uVar19;
              uVar27 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (long)puVar15 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar22);
              puVar15 = puVar15 + 1;
              puVar18 = puVar18 + 1;
            } while (uVar19 == uVar13);
          }
        }
        else {
LAB_00199258:
          if ((puVar15 < puVar2) && ((int)*puVar18 == (int)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar18 = (ulong *)((long)puVar18 + 4);
          }
          if ((puVar15 < puVar3) && ((short)*puVar18 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar18 = (ulong *)((long)puVar18 + 2);
          }
          if (puVar15 < puVar4) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar18 == (char)*puVar15));
          }
          uVar27 = (long)puVar15 - (long)puVar22;
        }
        uVar27 = uVar27 + 4;
        UVar23 = 1;
        ip_00 = (ulong *)((long)ip_00 + 1U);
LAB_001994fc:
        uVar19 = (long)ip_00 - (long)src;
        puVar15 = (ulong *)seqStore->lit;
        puVar22 = (ulong *)((long)puVar15 + uVar19);
        do {
          *puVar15 = *src;
          puVar15 = puVar15 + 1;
          src = (void *)((long)src + 8);
        } while (puVar15 < puVar22);
        seqStore->lit = seqStore->lit + uVar19;
        if (0xffff < uVar19) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9 = seqStore->sequences;
        psVar9->litLength = (U16)uVar19;
        psVar9->offset = UVar23;
        if (0xffff < uVar27 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9->matchLength = (U16)(uVar27 - 3);
        seqStore->sequences = psVar9 + 1;
        ip_00 = (ulong *)((long)ip_00 + uVar27);
        uVar19 = (ulong)local_94;
        src = ip_00;
        if ((local_94 != 0) && (ip_00 <= puVar24)) {
          while (uVar27 = uVar20, uVar13 = uVar19, src = ip_00, uVar19 = uVar13, uVar20 = uVar27,
                (int)*ip_00 == *(int *)((long)ip_00 - uVar13)) {
            puVar22 = (ulong *)((long)ip_00 + 4);
            puVar18 = (ulong *)((long)ip_00 + (4 - uVar13));
            puVar15 = puVar22;
            if (puVar22 < puVar1) {
              uVar20 = *puVar22 ^ *puVar18;
              uVar19 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar19 = uVar19 >> 3 & 0x1fffffff;
              if (*puVar18 == *puVar22) {
                puVar15 = (ulong *)((long)ip_00 + 0xc);
                puVar18 = (ulong *)((long)ip_00 + (0xc - uVar13));
                do {
                  if (puVar1 <= puVar15) goto LAB_0019963b;
                  uVar20 = *puVar18;
                  uVar25 = *puVar15;
                  uVar28 = uVar25 ^ uVar20;
                  uVar19 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (long)puVar15 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar22);
                  puVar15 = puVar15 + 1;
                  puVar18 = puVar18 + 1;
                } while (uVar20 == uVar25);
              }
            }
            else {
LAB_0019963b:
              if ((puVar15 < puVar2) && ((int)*puVar18 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar15 < puVar3) && ((short)*puVar18 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar15 < puVar4) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar18 == (char)*puVar15));
              }
              uVar19 = (long)puVar15 - (long)puVar22;
            }
            *(ulong *)seqStore->lit = *ip_00;
            psVar9 = seqStore->sequences;
            psVar9->litLength = 0;
            psVar9->offset = 1;
            if (0xffff < uVar19 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar9->matchLength = (U16)(uVar19 + 1);
            seqStore->sequences = psVar9 + 1;
            ip_00 = (ulong *)((long)ip_00 + uVar19 + 4);
            src = ip_00;
            uVar19 = uVar27;
            uVar20 = uVar13;
            if (((int)uVar27 == 0) || (puVar24 < ip_00)) break;
          }
        }
      }
      uVar30 = (uint)uVar19;
      uVar29 = (uint)uVar20;
    } while (ip_00 < puVar24);
  }
  uVar12 = 0;
  if (uVar26 < uVar5) {
    uVar12 = uVar5;
  }
  if (uVar26 < uVar6) {
    uVar12 = uVar6;
  }
  if (uVar29 == 0) {
    uVar29 = uVar12;
  }
  if (uVar30 != 0) {
    uVar12 = uVar30;
  }
  *rep = uVar29;
  rep[1] = uVar12;
  return (long)puVar4 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}